

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O3

int luaB_close(lua_State *L)

{
  uint uVar1;
  int iVar2;
  lua_State *co;
  
  co = getco(L);
  uVar1 = auxstatus(L,co);
  if (uVar1 - 1 < 2) {
    iVar2 = lua_closethread(co,L);
    if (iVar2 == 0) {
      iVar2 = 1;
      lua_pushboolean(L,1);
    }
    else {
      lua_pushboolean(L,0);
      lua_xmove(co,L,1);
      iVar2 = 2;
    }
    return iVar2;
  }
  iVar2 = luaL_error(L,"cannot close a %s coroutine",statname[uVar1]);
  return iVar2;
}

Assistant:

static int luaB_close (lua_State *L) {
  lua_State *co = getco(L);
  int status = auxstatus(L, co);
  switch (status) {
    case COS_DEAD: case COS_YIELD: {
      status = lua_closethread(co, L);
      if (status == LUA_OK) {
        lua_pushboolean(L, 1);
        return 1;
      }
      else {
        lua_pushboolean(L, 0);
        lua_xmove(co, L, 1);  /* move error message */
        return 2;
      }
    }
    default:  /* normal or running coroutine */
      return luaL_error(L, "cannot close a %s coroutine", statname[status]);
  }
}